

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

void __thiscall CConnman::ProcessAddrFetch(CConnman *this)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  Mutex *pszName;
  CAddress *this_00;
  char *in_RDI;
  long in_FS_OFFSET;
  bool use_v2transport;
  CSemaphoreGrant grant;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock72;
  CAddress addr;
  string strDest;
  uint in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  CSemaphore *in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  undefined4 in_stack_ffffffffffffff68;
  uint uVar4;
  undefined4 in_stack_ffffffffffffff6c;
  undefined1 in_stack_ffffffffffffff9b;
  ConnectionType in_stack_ffffffffffffff9c;
  char *in_stack_ffffffffffffffa0;
  CSemaphoreGrant *in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffb7;
  CAddress *in_stack_ffffffffffffffb8;
  CConnman *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockNotHeldInline
            ((char *)in_stack_ffffffffffffff38,(char *)in_stack_ffffffffffffff30,
             in_stack_ffffffffffffff2c,(Mutex *)0x100624a);
  std::__cxx11::string::string(in_stack_ffffffffffffff40);
  pszName = MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28)
                             );
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
             (AnnotatedMixin<std::mutex> *)
             CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),(char *)pszName,in_RDI,
             (int)((ulong)in_stack_ffffffffffffff48 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffff48 >> 0x18,0));
  bVar2 = std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  if (!bVar2) {
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::front((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffff38);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_ffffffffffffff38,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff30);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_front((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  }
  uVar4 = (uint)bVar2;
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  if (uVar4 == 0) {
    this_00 = (CAddress *)
              GetLocalServices((CConnman *)
                               CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    bVar3 = (byte)((ulong)this_00 >> 0xb) & 1;
    CAddress::CAddress(this_00);
    std::unique_ptr<CSemaphore,_std::default_delete<CSemaphore>_>::operator*
              ((unique_ptr<CSemaphore,_std::default_delete<CSemaphore>_> *)in_stack_ffffffffffffff38
              );
    CSemaphoreGrant::CSemaphoreGrant
              ((CSemaphoreGrant *)in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
               SUB41((uint)in_stack_ffffffffffffff2c >> 0x18,0));
    bVar2 = CSemaphoreGrant::operator_cast_to_bool
                      ((CSemaphoreGrant *)
                       CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    if (bVar2) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      in_stack_ffffffffffffff28 = bVar3 & 1;
      OpenNetworkConnection
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(bool)in_stack_ffffffffffffffb7
                 ,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                 (bool)in_stack_ffffffffffffff9b);
    }
    CSemaphoreGrant::~CSemaphoreGrant
              ((CSemaphoreGrant *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    CAddress::~CAddress((CAddress *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  }
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CConnman::ProcessAddrFetch()
{
    AssertLockNotHeld(m_unused_i2p_sessions_mutex);
    std::string strDest;
    {
        LOCK(m_addr_fetches_mutex);
        if (m_addr_fetches.empty())
            return;
        strDest = m_addr_fetches.front();
        m_addr_fetches.pop_front();
    }
    // Attempt v2 connection if we support v2 - we'll reconnect with v1 if our
    // peer doesn't support it or immediately disconnects us for another reason.
    const bool use_v2transport(GetLocalServices() & NODE_P2P_V2);
    CAddress addr;
    CSemaphoreGrant grant(*semOutbound, /*fTry=*/true);
    if (grant) {
        OpenNetworkConnection(addr, false, std::move(grant), strDest.c_str(), ConnectionType::ADDR_FETCH, use_v2transport);
    }
}